

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureAddLevel(int *pRc,Fts5Structure **ppStruct)

{
  int iVar1;
  Fts5Structure *pFVar2;
  sqlite3_int64 nByte;
  int nLevel;
  Fts5Structure *pStruct;
  Fts5Structure **ppStruct_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    iVar1 = (*ppStruct)->nLevel;
    pFVar2 = (Fts5Structure *)sqlite3_realloc64(*ppStruct,(long)(iVar1 + 1) * 0x10 + 0x28);
    if (pFVar2 == (Fts5Structure *)0x0) {
      *pRc = 7;
    }
    else {
      memset(pFVar2->aLevel + iVar1,0,0x10);
      pFVar2->nLevel = pFVar2->nLevel + 1;
      *ppStruct = pFVar2;
    }
  }
  return;
}

Assistant:

static void fts5StructureAddLevel(int *pRc, Fts5Structure **ppStruct){
  if( *pRc==SQLITE_OK ){
    Fts5Structure *pStruct = *ppStruct;
    int nLevel = pStruct->nLevel;
    sqlite3_int64 nByte = (
        sizeof(Fts5Structure) +                  /* Main structure */
        sizeof(Fts5StructureLevel) * (nLevel+1)  /* aLevel[] array */
    );

    pStruct = sqlite3_realloc64(pStruct, nByte);
    if( pStruct ){
      memset(&pStruct->aLevel[nLevel], 0, sizeof(Fts5StructureLevel));
      pStruct->nLevel++;
      *ppStruct = pStruct;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}